

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebug::putUInt128(QDebug *this,void *p)

{
  long lVar1;
  Stream *this_00;
  undefined1 n [16];
  char *string;
  long in_FS_OFFSET;
  Int128Buffer buffer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->stream;
  n._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  n._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  string = anon_unknown.dwarf_1f04a6::i128ToStringHelper
                     ((anon_unknown_dwarf_1f04a6 *)&stack0xffffffffffffffb8,*p,(quint128)n);
  QTextStream::operator<<(&this_00->ts,string);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDebug::putUInt128([[maybe_unused]] const void *p)
{
#ifdef QT_SUPPORTS_INT128
    Q_ASSERT(p);
    quint128 i;
    memcpy(&i, p, sizeof(i)); // alignment paranoia
    Int128Buffer buffer;
    stream->ts << i128ToStringHelper(buffer, i);
    return;
#endif // QT_SUPPORTS_INT128
    stream->ts << int128Warning();
}